

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleMainExtended.cpp
# Opt level: O2

int enumCallBack(int index,char **buff)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  string got;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar3 = (long)index + 1;
  std::__cxx11::string::string((string *)&local_38,buff[(long)index + 1],&local_39);
  bVar1 = std::operator==(&local_38,"abc");
  if (!bVar1) {
    bVar1 = std::operator==(&local_38,"def");
    if (!bVar1) {
      bVar1 = std::operator==(&local_38,"xyz");
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"gor wrong enum");
        goto LAB_00109e27;
      }
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"got enum ");
  poVar2 = std::operator<<(poVar2,buff[lVar3]);
LAB_00109e27:
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_38);
  return (int)lVar3;
}

Assistant:

int enumCallBack(int index, char **buff) {
    index++;
    string got = string(buff[index]);
    if (got == "abc" || got == "def" || got == "xyz") {
        cout << "got enum " << buff[index] << endl;
    } else {
        cout << "gor wrong enum" << endl;
    }
    return index;
}